

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

bool __thiscall
QFontDatabasePrivate::isApplicationFont(QFontDatabasePrivate *this,QString *fileName)

{
  ulong uVar1;
  char16_t *pcVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  bool bVar6;
  qsizetype *pqVar7;
  bool bVar8;
  QStringView QVar9;
  QStringView QVar10;
  
  uVar1 = (this->applicationFonts).d.size;
  if (uVar1 == 0) {
    bVar6 = false;
  }
  else {
    pcVar2 = (fileName->d).ptr;
    lVar3 = (fileName->d).size;
    pqVar7 = &(((this->applicationFonts).d.ptr)->fileName).d.size;
    bVar6 = true;
    uVar5 = 1;
    do {
      if ((*pqVar7 == lVar3) &&
         (QVar9.m_data = (char16_t *)pqVar7[-1], QVar9.m_size = lVar3, QVar10.m_data = pcVar2,
         QVar10.m_size = lVar3, cVar4 = QtPrivate::equalStrings(QVar9,QVar10), cVar4 != '\0')) {
        return bVar6;
      }
      bVar6 = uVar5 < uVar1;
      pqVar7 = pqVar7 + 9;
      bVar8 = uVar5 != uVar1;
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  return bVar6;
}

Assistant:

bool QFontDatabasePrivate::isApplicationFont(const QString &fileName)
{
    for (int i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).fileName == fileName)
            return true;
    return false;
}